

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

void findNotifyBits(void)

{
  callback_t *pcVar1;
  callback_t **ppcVar2;
  uint32_t bits;
  
  bits = 0;
  ppcVar2 = &gCallBackFirst;
  while (pcVar1 = *ppcVar2, pcVar1 != (callback_t *)0x0) {
    bits = bits | 1 << ((byte)pcVar1->gpio & 0x1f);
    ppcVar2 = &pcVar1->next;
  }
  if (bits == gNotifyBits) {
    return;
  }
  gNotifyBits = bits;
  pigpio_command(gPigCommand,0x13,gPigHandle,bits,1);
  return;
}

Assistant:

static void findNotifyBits(void)
{
   callback_t *p;
   uint32_t bits = 0;

   p = gCallBackFirst;

   while (p)
   {
      bits |= (1<<(p->gpio));
      p = p->next;
   }

   if (bits != gNotifyBits)
   {
      gNotifyBits = bits;
      pigpio_command(gPigCommand, PI_CMD_NB, gPigHandle, gNotifyBits, 1);
   }
}